

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O0

uint64_t pmull_h(uint64_t op1,uint64_t op2)

{
  uint64_t mask;
  ulong uStack_20;
  int i;
  uint64_t result;
  uint64_t op2_local;
  uint64_t op1_local;
  
  uStack_20 = 0;
  result = op2;
  op2_local = op1;
  for (mask._4_4_ = 0; mask._4_4_ < 8; mask._4_4_ = mask._4_4_ + 1) {
    uStack_20 = result & (op2_local & 0x1000100010001) * 0xffff ^ uStack_20;
    op2_local = op2_local >> 1;
    result = result << 1;
  }
  return uStack_20;
}

Assistant:

static uint64_t pmull_h(uint64_t op1, uint64_t op2)
{
    uint64_t result = 0;
    int i;

    for (i = 0; i < 8; ++i) {
        uint64_t mask = (op1 & 0x0001000100010001ull) * 0xffff;
        result ^= op2 & mask;
        op1 >>= 1;
        op2 <<= 1;
    }
    return result;
}